

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

HelperCallOpnd * IR::HelperCallOpnd::New(JnHelperMethod fnHelper,Func *func)

{
  JitArenaAllocator *pJVar1;
  HelperCallOpnd *this;
  TrackAllocData local_48;
  HelperCallOpnd *local_20;
  HelperCallOpnd *helperCallOpnd;
  Func *func_local;
  JnHelperMethod fnHelper_local;
  
  pJVar1 = func->m_alloc;
  helperCallOpnd = (HelperCallOpnd *)func;
  func_local._4_4_ = fnHelper;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0x7b0);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_48);
  this = (HelperCallOpnd *)new<Memory::JitArenaAllocator>(0x18,pJVar1,0x4e98c0);
  memset(this,0,0x18);
  HelperCallOpnd(this);
  local_20 = this;
  Init(this,func_local._4_4_);
  return local_20;
}

Assistant:

HelperCallOpnd *
HelperCallOpnd::New(JnHelperMethod fnHelper, Func *func)
{
    HelperCallOpnd *helperCallOpnd = JitAnew(func->m_alloc, IR::HelperCallOpnd);
    helperCallOpnd->Init(fnHelper);

    return helperCallOpnd;
}